

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O0

Kernel * Kernel::gaussian(int width,int height,float sigma)

{
  __type _Var1;
  double dVar2;
  int in_EDX;
  int in_ESI;
  Kernel *in_RDI;
  float fVar3;
  double e_pow;
  double scale;
  float sigma_pow2;
  int x;
  int y;
  Kernel *g;
  int in_stack_ffffffffffffff78;
  Kernel *in_stack_ffffffffffffff80;
  Kernel *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Kernel *in_stack_ffffffffffffffd0;
  int local_20;
  int local_1c;
  
  Kernel(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  for (local_1c = -in_EDX / 2; local_1c <= in_EDX / 2; local_1c = local_1c + 1) {
    for (local_20 = -in_ESI / 2; local_20 <= in_ESI / 2; local_20 = local_20 + 1) {
      _Var1 = std::pow<float,int>(0.0,0x11c054);
      fVar3 = (float)_Var1;
      in_stack_ffffffffffffff90 = (Kernel *)std::pow<int,int>(0,0x11c0a2);
      _Var1 = std::pow<int,int>(0,0x11c0b8);
      dVar2 = pow(2.718281828459045,
                  -(((double)in_stack_ffffffffffffff90 + _Var1) / (double)(fVar3 + fVar3)));
      fVar3 = (float)((1.0 / ((double)fVar3 * 6.283185307179586)) * dVar2);
      in_stack_ffffffffffffff80 =
           (Kernel *)operator()(in_stack_ffffffffffffff80,(int)fVar3,in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff80->width = (int)fVar3;
    }
  }
  normalize(in_stack_ffffffffffffff90);
  return in_RDI;
}

Assistant:

Kernel Kernel::gaussian(int width, int height, float sigma) {
  Kernel g(width, height);
  for (int y = -height / 2; y <= height / 2; y++) {
    for (int x = -width / 2; x <= width / 2; x++) {
      auto sigma_pow2 = (float) std::pow(sigma, 2);
      auto scale = 1 / (2.0 * M_PI * sigma_pow2);
      auto e_pow = std::pow(M_E, -((std::pow(x, 2) + std::pow(y, 2)) / (2 * sigma_pow2)));
      g(x, y) = static_cast<float>(scale * e_pow);
    }
  }
  g.normalize();
  return g;
}